

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfo.cpp
# Opt level: O3

GMM_STATUS
GmmGetLogicalTileShape
          (uint32_t TileMode,uint32_t *pWidthInBytes,uint32_t *pHeight,uint32_t *pDepth,
          GMM_LIB_CONTEXT *pGmmLibContext)

{
  if (pWidthInBytes != (uint32_t *)0x0) {
    *pWidthInBytes = (pGmmLibContext->pPlatformInfo->Data).TileInfo[TileMode].LogicalTileWidth;
  }
  if (pHeight != (uint32_t *)0x0) {
    *pHeight = (pGmmLibContext->pPlatformInfo->Data).TileInfo[TileMode].LogicalTileHeight;
  }
  if (pDepth != (uint32_t *)0x0) {
    *pDepth = (pGmmLibContext->pPlatformInfo->Data).TileInfo[TileMode].LogicalTileDepth;
  }
  return GMM_SUCCESS;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmGetLogicalTileShape(uint32_t  TileMode,
                                              uint32_t *pWidthInBytes,
                                              uint32_t *pHeight,
                                              uint32_t *pDepth,
                                              GMM_LIB_CONTEXT *pGmmLibContext)
{
    __GMM_ASSERT(TileMode < GMM_TILE_MODES);

    if(pWidthInBytes)
    {
        *pWidthInBytes = pGmmLibContext->GetPlatformInfo().TileInfo[TileMode].LogicalTileWidth;
    }

    if(pHeight)
    {
        *pHeight = pGmmLibContext->GetPlatformInfo().TileInfo[TileMode].LogicalTileHeight;
    }

    if(pDepth)
    {
        *pDepth = pGmmLibContext->GetPlatformInfo().TileInfo[TileMode].LogicalTileDepth;
    }

    return GMM_SUCCESS;
}